

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O0

int archive_write_client_close(archive_write_filter *f)

{
  long lVar1;
  long *__ptr;
  long lVar2;
  long in_RDI;
  int ret;
  ssize_t bytes_written;
  ssize_t target_block_length;
  ssize_t block_length;
  archive_none *state;
  archive_write *a;
  int local_34;
  long local_28;
  long local_20;
  
  lVar1 = *(long *)(in_RDI + 8);
  __ptr = *(long **)(in_RDI + 0x40);
  local_34 = 0;
  if (__ptr[3] != __ptr[2]) {
    local_20 = *__ptr - __ptr[1];
    if (*(int *)(lVar1 + 0xbc) < 1) {
      local_28 = (long)*(int *)(lVar1 + 0xb8);
    }
    else {
      local_28 = (long)*(int *)(lVar1 + 0xbc) *
                 ((local_20 + *(int *)(lVar1 + 0xbc) + -1) / (long)*(int *)(lVar1 + 0xbc));
    }
    if (*(int *)(lVar1 + 0xb8) < local_28) {
      local_28 = (long)*(int *)(lVar1 + 0xb8);
    }
    if (local_20 < local_28) {
      memset((void *)__ptr[3],0,local_28 - local_20);
      local_20 = local_28;
    }
    lVar2 = (**(code **)(lVar1 + 0xa0))(lVar1,*(undefined8 *)(lVar1 + 0xb0),__ptr[2],local_20);
    local_34 = 0;
    if (lVar2 < 1) {
      local_34 = -0x1e;
    }
  }
  if (*(long *)(lVar1 + 0xa8) != 0) {
    (**(code **)(lVar1 + 0xa8))(lVar1,*(undefined8 *)(lVar1 + 0xb0));
  }
  free((void *)__ptr[2]);
  free(__ptr);
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(lVar1 + 0xb0) = 0;
  return local_34;
}

Assistant:

static int
archive_write_client_close(struct archive_write_filter *f)
{
	struct archive_write *a = (struct archive_write *)f->archive;
	struct archive_none *state = (struct archive_none *)f->data;
	ssize_t block_length;
	ssize_t target_block_length;
	ssize_t bytes_written;
	int ret = ARCHIVE_OK;

	/* If there's pending data, pad and write the last block */
	if (state->next != state->buffer) {
		block_length = state->buffer_size - state->avail;

		/* Tricky calculation to determine size of last block */
		if (a->bytes_in_last_block <= 0)
			/* Default or Zero: pad to full block */
			target_block_length = a->bytes_per_block;
		else
			/* Round to next multiple of bytes_in_last_block. */
			target_block_length = a->bytes_in_last_block *
			    ( (block_length + a->bytes_in_last_block - 1) /
			        a->bytes_in_last_block);
		if (target_block_length > a->bytes_per_block)
			target_block_length = a->bytes_per_block;
		if (block_length < target_block_length) {
			memset(state->next, 0,
			    target_block_length - block_length);
			block_length = target_block_length;
		}
		bytes_written = (a->client_writer)(&a->archive,
		    a->client_data, state->buffer, block_length);
		ret = bytes_written <= 0 ? ARCHIVE_FATAL : ARCHIVE_OK;
	}
	if (a->client_closer)
		(*a->client_closer)(&a->archive, a->client_data);
	free(state->buffer);
	free(state);
	/* Clear the close handler myself not to be called again. */
	f->close = NULL;
	a->client_data = NULL;
	return (ret);
}